

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

bool __thiscall
SoftHSM::setECPrivateKey(SoftHSM *this,OSObject *key,ByteString *ber,Token *token,bool isPrivate)

{
  char cVar1;
  undefined1 uVar2;
  int iVar3;
  CryptoFactory *pCVar4;
  undefined4 extraout_var;
  long *plVar6;
  char *pcVar7;
  ByteString *pBVar8;
  ByteString value;
  ByteString group;
  ByteString local_120;
  ByteString local_f8;
  OSAttribute local_d0;
  long *plVar5;
  
  pCVar4 = CryptoFactory::i();
  iVar3 = (*pCVar4->_vptr_CryptoFactory[2])(pCVar4,5);
  plVar5 = (long *)CONCAT44(extraout_var,iVar3);
  if (plVar5 != (long *)0x0) {
    plVar6 = (long *)(**(code **)(*plVar5 + 0xb0))(plVar5);
    if (plVar6 != (long *)0x0) {
      cVar1 = (**(code **)(*plVar6 + 0x38))(plVar6,ber);
      if (cVar1 != '\0') {
        ByteString::ByteString(&local_f8);
        ByteString::ByteString(&local_120);
        if (isPrivate) {
          pcVar7 = (char *)(**(code **)(*plVar6 + 0x60))(plVar6);
          Token::encrypt(token,pcVar7,(int)&local_f8);
          pcVar7 = (char *)(**(code **)(*plVar6 + 0x58))(plVar6);
          Token::encrypt(token,pcVar7,(int)&local_120);
        }
        else {
          pBVar8 = (ByteString *)(**(code **)(*plVar6 + 0x60))(plVar6);
          ByteString::operator=(&local_f8,pBVar8);
          pBVar8 = (ByteString *)(**(code **)(*plVar6 + 0x58))(plVar6);
          ByteString::operator=(&local_120,pBVar8);
        }
        OSAttribute::OSAttribute(&local_d0,&local_f8);
        iVar3 = (*key->_vptr_OSObject[8])(key,0x180,&local_d0);
        OSAttribute::~OSAttribute(&local_d0);
        if ((char)iVar3 == '\0') {
          uVar2 = 0;
        }
        else {
          OSAttribute::OSAttribute(&local_d0,&local_120);
          iVar3 = (*key->_vptr_OSObject[8])(key,0x11,&local_d0);
          uVar2 = (undefined1)iVar3;
          OSAttribute::~OSAttribute(&local_d0);
        }
        (**(code **)(*plVar5 + 0xd8))(plVar5,plVar6);
        pCVar4 = CryptoFactory::i();
        (*pCVar4->_vptr_CryptoFactory[3])(pCVar4,plVar5);
        local_120._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
        std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                  (&local_120.byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
        local_f8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
        std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                  (&local_f8.byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
        return (bool)uVar2;
      }
      (**(code **)(*plVar5 + 0xd8))(plVar5,plVar6);
    }
    pCVar4 = CryptoFactory::i();
    (*pCVar4->_vptr_CryptoFactory[3])(pCVar4,plVar5);
  }
  return false;
}

Assistant:

bool SoftHSM::setECPrivateKey(OSObject* key, const ByteString &ber, Token* token, bool isPrivate) const
{
	AsymmetricAlgorithm* ecc = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::ECDSA);
	if (ecc == NULL)
		return false;
	PrivateKey* priv = ecc->newPrivateKey();
	if (priv == NULL)
	{
		CryptoFactory::i()->recycleAsymmetricAlgorithm(ecc);
		return false;
	}
	if (!priv->PKCS8Decode(ber))
	{
		ecc->recyclePrivateKey(priv);
		CryptoFactory::i()->recycleAsymmetricAlgorithm(ecc);
		return false;
	}
	// EC Private Key Attributes
	ByteString group;
	ByteString value;
	if (isPrivate)
	{
		token->encrypt(((ECPrivateKey*)priv)->getEC(), group);
		token->encrypt(((ECPrivateKey*)priv)->getD(), value);
	}
	else
	{
		group = ((ECPrivateKey*)priv)->getEC();
		value = ((ECPrivateKey*)priv)->getD();
	}
	bool bOK = true;
	bOK = bOK && key->setAttribute(CKA_EC_PARAMS, group);
	bOK = bOK && key->setAttribute(CKA_VALUE, value);

	ecc->recyclePrivateKey(priv);
	CryptoFactory::i()->recycleAsymmetricAlgorithm(ecc);

	return bOK;
}